

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall CLIntercept::stopAubCapture(CLIntercept *this,cl_command_queue command_queue)

{
  cl_icd_dispatch *pcVar1;
  cl_command_queue in_RSI;
  CLIntercept *in_RDI;
  double __x;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff88;
  allocator *paVar2;
  lock_guard<std::mutex> *in_stack_ffffffffffffff90;
  allocator local_49;
  string local_48 [16];
  uint64_t in_stack_ffffffffffffffc8;
  Services *in_stack_ffffffffffffffd0;
  
  if ((in_RDI->m_AubCaptureStarted & 1U) == 1) {
    std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if ((in_RDI->m_AubCaptureStarted & 1U) == 1) {
      if (in_RSI != (cl_command_queue)0x0) {
        pcVar1 = dispatch(in_RDI);
        (*pcVar1->clFinish)(in_RSI);
      }
      OS(in_RDI);
      config(in_RDI);
      ::OS::Services::StopAubCapture(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      paVar2 = &local_49;
      std::allocator<char>::allocator();
      __x = (double)std::__cxx11::string::string(local_48,"AubCapture stopped.\n",paVar2);
      log(in_RDI,__x);
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
      in_RDI->m_AubCaptureStarted = false;
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1d5bcc);
  }
  return;
}

Assistant:

void CLIntercept::stopAubCapture(
    cl_command_queue command_queue )
{
    if( m_AubCaptureStarted == true )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        if( m_AubCaptureStarted == true )
        {
            if( command_queue )
            {
                dispatch().clFinish( command_queue );
            }

#if defined(_WIN32)
            if( m_Config.AubCaptureKDC )
            {
                OS().StopAubCaptureKDC(
                    config().AubCaptureEndWait );
            }
            else
#endif
            {
                OS().StopAubCapture(
                    config().AubCaptureEndWait );
            }
            log( "AubCapture stopped.\n" );

            // No matter what, clar the flag that aubcapture is started, so we
            // don't try again.
            m_AubCaptureStarted = false;
        }
    }
}